

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O1

int ompt_get_callback(ompt_callbacks_t which,ompt_callback_t *callback)

{
  ompt_callback_target_data_op_t p_Var1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  bool bVar5;
  
  bVar2 = ompt_enabled._0_1_;
  if (((ulong)ompt_enabled & 1) == 0) {
switchD_001767b0_default:
    bVar4 = 0;
    goto LAB_00176a50;
  }
  uVar3 = ompt_enabled._0_4_;
  bVar4 = ompt_enabled._3_1_;
  switch(which) {
  case ompt_callback_thread_begin:
    bVar4 = bVar2 >> 1;
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_thread_begin_callback;
    break;
  case ompt_callback_thread_end:
    bVar4 = bVar2 >> 2;
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_thread_end_callback;
    break;
  case ompt_callback_parallel_begin:
    bVar4 = bVar2 >> 3;
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_parallel_begin_callback;
    break;
  case ompt_callback_parallel_end:
    bVar4 = bVar2 >> 4;
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_parallel_end_callback;
    break;
  case ompt_callback_task_create:
    bVar4 = bVar2 >> 5;
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_task_create_callback;
    break;
  case ompt_callback_task_schedule:
    bVar4 = bVar2 >> 6;
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_task_schedule_callback;
    break;
  case ompt_callback_implicit_task:
    bVar5 = (char)bVar2 < '\0';
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_implicit_task_callback;
    goto LAB_001769c4;
  case ompt_callback_target:
    bVar4 = ompt_enabled._1_1_;
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_target_callback;
    break;
  case ompt_callback_target_data_op:
    bVar4 = (byte)(uVar3 >> 9);
    p_Var1 = ompt_callbacks.ompt_callback_target_data_op_callback;
    break;
  case ompt_callback_target_submit:
    bVar4 = (byte)(uVar3 >> 10);
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_target_submit_callback;
    break;
  case ompt_callback_control_tool:
    bVar4 = (byte)(uVar3 >> 0xb);
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_control_tool_callback;
    break;
  case ompt_callback_device_initialize:
    bVar4 = (byte)(uVar3 >> 0xc);
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_device_initialize_callback
    ;
    break;
  case ompt_callback_device_finalize:
    bVar4 = (byte)(uVar3 >> 0xd);
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_device_finalize_callback;
    break;
  case ompt_callback_device_load:
    bVar4 = (byte)(uVar3 >> 0xe);
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_device_load_callback;
    break;
  case ompt_callback_device_unload:
    bVar5 = ompt_enabled._0_2_ < 0;
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_device_unload_callback;
    goto LAB_001769c4;
  case ompt_callback_sync_region_wait:
    bVar4 = ompt_enabled._2_1_;
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_sync_region_wait_callback;
    break;
  case ompt_callback_mutex_released:
    bVar4 = (byte)(uVar3 >> 0x11);
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_mutex_released_callback;
    break;
  case ompt_callback_dependences:
    bVar4 = (byte)(uVar3 >> 0x12);
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_dependences_callback;
    break;
  case ompt_callback_task_dependence:
    bVar4 = (byte)(uVar3 >> 0x13);
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_task_dependence_callback;
    break;
  case ompt_callback_work:
    bVar4 = (byte)(uVar3 >> 0x14);
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_work_callback;
    break;
  case ompt_callback_master:
    bVar4 = (byte)(uVar3 >> 0x15);
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_master_callback;
    break;
  case ompt_callback_target_map:
    bVar4 = (byte)(uVar3 >> 0x16);
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_target_map_callback;
    break;
  case ompt_callback_sync_region:
    bVar4 = (byte)(uVar3 >> 0x17);
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_sync_region_callback;
    break;
  case ompt_callback_lock_init:
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_lock_init_callback;
    break;
  case ompt_callback_lock_destroy:
    bVar4 = bVar4 >> 1;
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_lock_destroy_callback;
    break;
  case ompt_callback_mutex_acquire:
    bVar4 = bVar4 >> 2;
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_mutex_acquire_callback;
    break;
  case ompt_callback_mutex_acquired:
    bVar4 = bVar4 >> 3;
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_mutex_acquired_callback;
    break;
  case ompt_callback_nest_lock:
    bVar4 = bVar4 >> 4;
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_nest_lock_callback;
    break;
  case ompt_callback_flush:
    bVar4 = bVar4 >> 5;
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_flush_callback;
    break;
  case ompt_callback_cancel:
    bVar4 = bVar4 >> 6;
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_cancel_callback;
    break;
  case ompt_callback_reduction:
    bVar5 = (int)uVar3 < 0;
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_reduction_callback;
LAB_001769c4:
    bVar4 = p_Var1 != (ompt_callback_target_data_op_t)0x0 & bVar5;
    if (bVar4 == 0) goto LAB_00176a50;
    goto LAB_00176a4d;
  case ompt_callback_dispatch:
    bVar4 = ompt_callbacks.ompt_callback_dispatch_callback != (ompt_callback_dispatch_t)0x0 &
            ompt_enabled._4_1_;
    p_Var1 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_dispatch_callback;
    if (bVar4 != 1) goto LAB_00176a50;
    goto LAB_00176a4d;
  default:
    goto switchD_001767b0_default;
  }
  bVar4 = p_Var1 != (ompt_callback_target_data_op_t)0x0 & bVar4;
  if (bVar4 != 0) {
LAB_00176a4d:
    *callback = (ompt_callback_t)p_Var1;
  }
LAB_00176a50:
  return (int)bVar4;
}

Assistant:

OMPT_API_ROUTINE int ompt_get_callback(ompt_callbacks_t which,
                                       ompt_callback_t *callback) {
  if (!ompt_enabled.enabled)
    return ompt_get_callback_failure;

  switch (which) {

#define ompt_event_macro(event_name, callback_type, event_id)                  \
  case event_name:                                                             \
    if (ompt_event_implementation_status(event_name)) {                        \
      ompt_callback_t mycb =                                                   \
          (ompt_callback_t)ompt_callbacks.ompt_callback(event_name);           \
      if (ompt_enabled.event_name && mycb) {                                   \
        *callback = mycb;                                                      \
        return ompt_get_callback_success;                                      \
      }                                                                        \
    }                                                                          \
    return ompt_get_callback_failure;

    FOREACH_OMPT_EVENT(ompt_event_macro)

#undef ompt_event_macro

  default:
    return ompt_get_callback_failure;
  }
}